

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

void secp256k1_ecdsa_signature_save
               (secp256k1_ecdsa_signature *sig,secp256k1_scalar *r,secp256k1_scalar *s)

{
  secp256k1_scalar_verify(r);
  sig->data[0x10] = '\0';
  sig->data[0x11] = '\0';
  sig->data[0x12] = '\0';
  sig->data[0x13] = '\0';
  sig->data[0x14] = '\0';
  sig->data[0x15] = '\0';
  sig->data[0x16] = '\0';
  sig->data[0x17] = '\0';
  sig->data[0x18] = '\0';
  sig->data[0x19] = '\0';
  sig->data[0x1a] = '\0';
  sig->data[0x1b] = '\0';
  sig->data[0x1c] = '\0';
  sig->data[0x1d] = '\0';
  sig->data[0x1e] = '\0';
  sig->data[0x1f] = '\0';
  sig->data[0] = '\0';
  sig->data[1] = '\0';
  sig->data[2] = '\0';
  sig->data[3] = '\0';
  sig->data[4] = '\0';
  sig->data[5] = '\0';
  sig->data[6] = '\0';
  sig->data[7] = '\0';
  sig->data[8] = '\0';
  sig->data[9] = '\0';
  sig->data[10] = '\0';
  sig->data[0xb] = '\0';
  sig->data[0xc] = '\0';
  sig->data[0xd] = '\0';
  sig->data[0xe] = '\0';
  sig->data[0xf] = '\0';
  sig->data[0x1c] = *(uchar *)((long)r + 3);
  sig->data[0x1d] = *(uchar *)((long)r + 2);
  sig->data[0x1e] = *(uchar *)((long)r + 1);
  sig->data[0x1f] = (uchar)*r;
  secp256k1_scalar_verify(s);
  sig->data[0x30] = '\0';
  sig->data[0x31] = '\0';
  sig->data[0x32] = '\0';
  sig->data[0x33] = '\0';
  sig->data[0x34] = '\0';
  sig->data[0x35] = '\0';
  sig->data[0x36] = '\0';
  sig->data[0x37] = '\0';
  sig->data[0x38] = '\0';
  sig->data[0x39] = '\0';
  sig->data[0x3a] = '\0';
  sig->data[0x3b] = '\0';
  sig->data[0x3c] = '\0';
  sig->data[0x3d] = '\0';
  sig->data[0x3e] = '\0';
  sig->data[0x3f] = '\0';
  sig->data[0x20] = '\0';
  sig->data[0x21] = '\0';
  sig->data[0x22] = '\0';
  sig->data[0x23] = '\0';
  sig->data[0x24] = '\0';
  sig->data[0x25] = '\0';
  sig->data[0x26] = '\0';
  sig->data[0x27] = '\0';
  sig->data[0x28] = '\0';
  sig->data[0x29] = '\0';
  sig->data[0x2a] = '\0';
  sig->data[0x2b] = '\0';
  sig->data[0x2c] = '\0';
  sig->data[0x2d] = '\0';
  sig->data[0x2e] = '\0';
  sig->data[0x2f] = '\0';
  sig->data[0x3c] = *(uchar *)((long)s + 3);
  sig->data[0x3d] = *(uchar *)((long)s + 2);
  sig->data[0x3e] = *(uchar *)((long)s + 1);
  sig->data[0x3f] = (uchar)*s;
  return;
}

Assistant:

static void secp256k1_ecdsa_signature_save(secp256k1_ecdsa_signature* sig, const secp256k1_scalar* r, const secp256k1_scalar* s) {
    if (sizeof(secp256k1_scalar) == 32) {
        memcpy(&sig->data[0], r, 32);
        memcpy(&sig->data[32], s, 32);
    } else {
        secp256k1_scalar_get_b32(&sig->data[0], r);
        secp256k1_scalar_get_b32(&sig->data[32], s);
    }
}